

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

Type * __thiscall
choc::value::Type::ComplexArray::getUniformType(Type *__return_storage_ptr__,ComplexArray *this)

{
  RepeatedGroup *pRVar1;
  ComplexArray *this_local;
  
  check((this->groups).size == 1,"This array does not contain a single element type");
  pRVar1 = AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::front(&this->groups);
  Type(__return_storage_ptr__,&pRVar1->elementType);
  return __return_storage_ptr__;
}

Assistant:

Type getUniformType() const
    {
        check (groups.size == 1, "This array does not contain a single element type");
        return groups.front().elementType;
    }